

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

region * create_gas_cloud(level *lev,xchar x,xchar y,int radius,int damage,int duration)

{
  uint uVar1;
  uint uVar2;
  region *reg;
  nhrect *__dest;
  char cVar3;
  uint uVar4;
  nhrect *__src;
  uint uVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  char cVar9;
  uint uVar10;
  byte local_7a;
  char local_79;
  char local_70;
  char local_68;
  
  reg = (region *)calloc(1,0x58);
  (reg->bounding_box).lx = 'c';
  (reg->bounding_box).ly = 'c';
  reg->ttl = -1;
  reg->expire_f = -1;
  reg->can_enter_f = -1;
  reg->enter_f = -1;
  reg->enter_f = -1;
  reg->can_leave_f = -1;
  reg->leave_f = -1;
  reg->inside_f = -1;
  reg->player_flags = '\x02';
  if (0 < radius) {
    uVar10 = radius + -1 + (uint)(byte)y;
    uVar2 = 0;
    local_79 = 'c';
    uVar1 = 0;
    local_7a = 99;
    uVar7 = 0;
    __src = (nhrect *)0x0;
    bVar8 = x;
    do {
      sVar6 = (short)uVar7;
      __dest = (nhrect *)malloc((long)sVar6 * 4 + 4);
      if (0 < sVar6) {
        memcpy(__dest,__src,(ulong)((uVar7 & 0xffff) << 2));
        free(__src);
      }
      uVar4 = (byte)(y - (char)(radius + -1)) + uVar7;
      uVar5 = (byte)x + uVar7;
      cVar9 = (char)uVar10;
      __dest[sVar6] =
           (nhrect)((uVar4 & 0xff) << 8 | (uint)bVar8 | (uVar5 & 0xff) << 0x10 | uVar10 << 0x18);
      if ((char)bVar8 < (char)local_7a) {
        (reg->bounding_box).lx = bVar8;
        local_7a = bVar8;
      }
      cVar3 = (char)uVar4;
      if (cVar3 < local_79) {
        (reg->bounding_box).ly = cVar3;
        local_79 = cVar3;
      }
      local_70 = (char)uVar1;
      if (local_70 < (char)uVar5) {
        (reg->bounding_box).hx = (char)uVar5;
        uVar1 = uVar5;
      }
      local_68 = (char)uVar2;
      if (local_68 < cVar9) {
        (reg->bounding_box).hy = cVar9;
        uVar2 = uVar10;
      }
      bVar8 = bVar8 - 1;
      uVar10 = (uint)(byte)(cVar9 - 1);
      uVar7 = uVar7 + 1;
      __src = __dest;
    } while (uVar7 != radius);
    reg->nrects = (short)uVar7;
    reg->rects = __dest;
  }
  reg->ttl = (short)duration;
  if (flags.mon_moving == '\0' && in_mklev == '\0') {
    reg->player_flags = '\0';
  }
  reg->inside_f = 0;
  reg->expire_f = 1;
  reg->arg = damage;
  reg->visible = '\x01';
  reg->effect_id = 0x40009;
  add_region(lev,reg);
  return reg;
}

Assistant:

struct region *create_gas_cloud(struct level *lev, xchar x, xchar y,
				int radius, int damage, int duration)
{
    struct region *cloud;
    int i, nrect;
    struct nhrect tmprect;

    cloud = create_region(NULL, 0);
    nrect = radius;
    tmprect.lx = x;
    tmprect.hx = x;
    tmprect.ly = y - (radius - 1);
    tmprect.hy = y + (radius - 1);
    for (i = 0; i < nrect; i++) {
	add_rect_to_reg(cloud, &tmprect);
	tmprect.lx--;
	tmprect.hx++;
	tmprect.ly++;
	tmprect.hy--;
    }
    cloud->ttl = duration;
    if (!in_mklev && !flags.mon_moving)
	set_heros_fault(cloud);		/* assume player has created it */
    cloud->inside_f = INSIDE_GAS_CLOUD;
    cloud->expire_f = EXPIRE_GAS_CLOUD;
    cloud->arg = damage;
    cloud->visible = TRUE;
    cloud->effect_id = dbuf_effect(E_MISC, E_gascloud);
    add_region(lev, cloud);
    return cloud;
}